

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O0

uint64_t al_get_audio_stream_played_samples(ALLEGRO_AUDIO_STREAM *stream)

{
  long in_RDI;
  ALLEGRO_MUTEX *stream_mutex;
  uint64_t result;
  undefined8 local_10;
  
  maybe_lock_mutex((ALLEGRO_MUTEX *)0x1104fa);
  if (*(long *)(in_RDI + 0x90) == 0) {
    local_10 = 0;
  }
  else {
    local_10 = *(long *)(in_RDI + 0x138) * (long)*(int *)(in_RDI + 0x8c) +
               (long)*(int *)(in_RDI + 0xbc);
  }
  maybe_unlock_mutex((ALLEGRO_MUTEX *)0x110551);
  return local_10;
}

Assistant:

uint64_t al_get_audio_stream_played_samples(const ALLEGRO_AUDIO_STREAM *stream)
{
   uint64_t result;
   ALLEGRO_MUTEX *stream_mutex;
   ASSERT(stream);

   stream_mutex = maybe_lock_mutex(stream->spl.mutex);
   if (stream->spl.spl_data.buffer.ptr) {
      result = stream->consumed_fragments * stream->spl.spl_data.len +
         stream->spl.pos;
   }
   else {
      result = 0;
   }
   maybe_unlock_mutex(stream_mutex);

   return result;
}